

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitTruth.c
# Opt level: O2

void Kit_TruthForallNew(uint *pRes,uint *pTruth,int nVars,int iVar)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  uint *puVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint *puVar12;
  
  uVar8 = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    uVar8 = 1;
  }
  if (iVar < nVars) {
    switch(iVar) {
    case 0:
      uVar5 = 0;
      uVar11 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar11 = uVar5;
      }
      for (; uVar11 != uVar5; uVar5 = uVar5 + 1) {
        uVar8 = pTruth[uVar5];
        pRes[uVar5] = (uVar8 >> 1 & 0x55555555) + (uVar8 & 0xd5555555) * 2 & uVar8;
      }
      break;
    case 1:
      uVar5 = 0;
      uVar11 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar11 = uVar5;
      }
      for (; uVar11 != uVar5; uVar5 = uVar5 + 1) {
        uVar8 = pTruth[uVar5];
        pRes[uVar5] = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0xf3333333) * 4 & uVar8;
      }
      break;
    case 2:
      uVar5 = 0;
      uVar11 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar11 = uVar5;
      }
      for (; uVar11 != uVar5; uVar5 = uVar5 + 1) {
        uVar8 = pTruth[uVar5];
        pRes[uVar5] = ((uVar8 & 0xf0f0f0f) << 4 | uVar8 >> 4 & 0xf0f0f0f) & uVar8;
      }
      break;
    case 3:
      uVar5 = 0;
      uVar11 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar11 = uVar5;
      }
      for (; uVar11 != uVar5; uVar5 = uVar5 + 1) {
        uVar8 = pTruth[uVar5];
        pRes[uVar5] = (((uVar8 & 0xff00) << 8 | uVar8 << 0x18) >> 0x10 |
                      (uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8) << 0x10) & uVar8;
      }
      break;
    case 4:
      uVar5 = 0;
      uVar11 = (ulong)uVar8;
      if ((int)uVar8 < 1) {
        uVar11 = uVar5;
      }
      for (; uVar11 != uVar5; uVar5 = uVar5 + 1) {
        uVar8 = pTruth[uVar5];
        pRes[uVar5] = (uVar8 << 0x10 | uVar8 >> 0x10) & uVar8;
      }
      break;
    default:
      bVar4 = (char)iVar - 5;
      bVar3 = bVar4 & 0x1f;
      uVar9 = 1 << bVar3;
      iVar6 = 2 << (bVar4 & 0x1f);
      iVar10 = 0 << bVar3;
      uVar11 = 0;
      if (0 < (int)uVar9) {
        uVar11 = (ulong)uVar9;
      }
      for (; puVar7 = pRes, puVar12 = pTruth, uVar5 = uVar11, iVar10 < (int)uVar8;
          iVar10 = iVar10 + iVar6) {
        while (uVar5 != 0) {
          uVar1 = puVar12[(int)uVar9];
          uVar2 = *puVar12;
          *puVar7 = uVar1 & uVar2;
          puVar7[(int)uVar9] = uVar1 & uVar2;
          puVar7 = puVar7 + 1;
          puVar12 = puVar12 + 1;
          uVar5 = uVar5 - 1;
        }
        pRes = pRes + iVar6;
        pTruth = pTruth + iVar6;
      }
    }
    return;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitTruth.c"
                ,0x368,"void Kit_TruthForallNew(unsigned int *, unsigned int *, int, int)");
}

Assistant:

void Kit_TruthForallNew( unsigned * pRes, unsigned * pTruth, int nVars, int iVar )
{
    int nWords = Kit_TruthWordNum( nVars );
    int i, k, Step;

    assert( iVar < nVars );
    switch ( iVar )
    {
    case 0:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] & (((pTruth[i] & 0xAAAAAAAA) >> 1) | ((pTruth[i] & 0x55555555) << 1));
        return;
    case 1:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] & (((pTruth[i] & 0xCCCCCCCC) >> 2) | ((pTruth[i] & 0x33333333) << 2));
        return;
    case 2:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] & (((pTruth[i] & 0xF0F0F0F0) >> 4) | ((pTruth[i] & 0x0F0F0F0F) << 4));
        return;
    case 3:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] & (((pTruth[i] & 0xFF00FF00) >> 8) | ((pTruth[i] & 0x00FF00FF) << 8));
        return;
    case 4:
        for ( i = 0; i < nWords; i++ )
            pRes[i] =  pTruth[i] & (((pTruth[i] & 0xFFFF0000) >> 16) | ((pTruth[i] & 0x0000FFFF) << 16));
        return;
    default:
        Step = (1 << (iVar - 5));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pRes[i]      = pTruth[i] & pTruth[Step+i];
                pRes[Step+i] = pRes[i];
            }
            pRes += 2*Step;
            pTruth += 2*Step;
        }
        return;
    }
}